

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.h
# Opt level: O0

void __thiscall booster::locale::ios_info::string_set::set<wchar_t>(string_set *this,wchar_t *s)

{
  void *pvVar1;
  wchar_t *local_20;
  wchar_t *end;
  wchar_t *s_local;
  string_set *this_local;
  
  if (*(void **)(this + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x10));
  }
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined **)this = &wchar_t::typeinfo;
  for (local_20 = s; *local_20 != L'\0'; local_20 = local_20 + 1) {
  }
  *(long *)(this + 8) = (((long)local_20 - (long)s >> 2) + 1) * 4;
  pvVar1 = operator_new__(*(ulong *)(this + 8));
  *(void **)(this + 0x10) = pvVar1;
  memcpy(*(void **)(this + 0x10),s,*(size_t *)(this + 8));
  return;
}

Assistant:

void set(Char const *s)
                {
                    delete [] ptr;
                    ptr = 0;
                    type=&typeid(Char);
                    Char const *end = s;
                    while(*end!=0) end++;
                    // if ptr = 0 it does not matter what is value of size
                    size = sizeof(Char)*(end - s+1);
                    ptr = new char[size];
                    memcpy(ptr,s,size);
                }